

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxStackVariable::Emit(FxStackVariable *this,VMFunctionBuilder *build)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  PType *pPVar4;
  uint opc;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ExpEmit EVar8;
  uint uVar9;
  
  sVar3 = this->membervar->Offset;
  if (sVar3 == 0) {
    opc = 0xffffffff;
  }
  else {
    opc = VMFunctionBuilder::GetConstantInt(build,(int)sVar3);
  }
  if (this->AddressRequested == true) {
    if ((int)opc < 0) {
      EVar8 = build->FramePointer;
      uVar5 = EVar8._2_4_ & 0xffff;
      uVar9 = EVar8._3_4_ & 0xff;
      uVar7 = (ulong)EVar8 & 0xffffffff00000000;
      goto LAB_00533597;
    }
    uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
    EVar8.Konst = false;
    EVar8.Fixed = false;
    EVar8.Final = false;
    EVar8.Target = false;
    EVar8.RegNum = (short)uVar5;
    EVar8.RegType = (char)(uVar5 >> 0x10);
    EVar8.RegCount = (char)(uVar5 >> 0x18);
    VMFunctionBuilder::Emit(build,0xcd,uVar5 & 0xffff,(uint)(build->FramePointer).RegNum,opc);
    uVar9 = 1;
    uVar5 = 3;
  }
  else {
    pPVar4 = this->membervar->Type;
    bVar1 = pPVar4->RegType;
    uVar5 = (uint)bVar1;
    bVar2 = pPVar4->RegCount;
    uVar9 = (uint)bVar2;
    uVar6 = VMFunctionBuilder::RegAvailability::Get(build->Registers + bVar1,(uint)bVar2);
    EVar8.Konst = false;
    EVar8.Fixed = false;
    EVar8.Final = false;
    EVar8.Target = false;
    EVar8.RegNum = (short)uVar6;
    EVar8.RegType = (char)(uVar6 >> 0x10);
    EVar8.RegCount = (char)(uVar6 >> 0x18);
    if (this->membervar->BitValue != -1) {
      uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
      if (-1 < (int)opc) {
        VMFunctionBuilder::Emit(build,0xcd,uVar5 & 0xffff,(uint)(build->FramePointer).RegNum,opc);
      }
      VMFunctionBuilder::RegAvailability::Return(build->Registers + 3,uVar5 & 0xffff,1);
      VMFunctionBuilder::Emit
                (build,0x24,uVar6 & 0xffff,uVar5 & 0xffff,
                 1 << ((byte)this->membervar->BitValue & 0x1f));
      uVar7 = 0;
      uVar5 = (uint)bVar1;
      goto LAB_00533597;
    }
    if (opc == 0xffffffff) {
      opc = VMFunctionBuilder::GetConstantInt(build,0);
    }
    VMFunctionBuilder::Emit
              (build,(uint)this->membervar->Type->loadOp,uVar6 & 0xffff,
               (uint)(build->FramePointer).RegNum,opc);
  }
  uVar7 = 0;
LAB_00533597:
  return (ExpEmit)((ulong)EVar8 & 0xffff | (ulong)((uVar5 & 0xff) << 0x10) | uVar9 << 0x18 | uVar7);
}

Assistant:

ExpEmit FxStackVariable::Emit(VMFunctionBuilder *build)
{
	int offsetreg = -1;
	
	if (membervar->Offset != 0) offsetreg = build->GetConstantInt((int)membervar->Offset);

	if (AddressRequested)
	{
		if (offsetreg >= 0)
		{
			ExpEmit obj(build, REGT_POINTER);
			build->Emit(OP_ADDA_RK, obj.RegNum, build->FramePointer.RegNum, offsetreg);
			return obj;
		}
		else
		{
			return build->FramePointer;
		}
	}
	ExpEmit loc(build, membervar->Type->GetRegType(), membervar->Type->GetRegCount());

	if (membervar->BitValue == -1)
	{
		if (offsetreg == -1) offsetreg = build->GetConstantInt(0);
		build->Emit(membervar->Type->GetLoadOp(), loc.RegNum, build->FramePointer.RegNum, offsetreg);
	}
	else
	{
		ExpEmit obj(build, REGT_POINTER);
		if (offsetreg >= 0) build->Emit(OP_ADDA_RK, obj.RegNum, build->FramePointer.RegNum, offsetreg);
		obj.Free(build);
		build->Emit(OP_LBIT, loc.RegNum, obj.RegNum, 1 << membervar->BitValue);
	}
	return loc;
}